

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pffft.c
# Opt level: O3

PFFFT_Setup * pffft_new_setup(int N,pffft_transform_t transform)

{
  int iVar1;
  int iVar2;
  int iVar3;
  PFFFT_Setup *s;
  void *pvVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  float *pfVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  v4sf *pafVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  
  s = (PFFFT_Setup *)malloc(0x60);
  if (transform == PFFFT_REAL) {
    if ((N < 1) || ((N & 0x1fU) != 0)) {
      __assert_fail("(N%(2*SIMD_SZ*SIMD_SZ))==0 && N>0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jcj83429[P]ShapingClipper/pffft.c"
                    ,0x4c0,"PFFFT_Setup *pffft_new_setup(int, pffft_transform_t)");
    }
  }
  else if ((transform == PFFFT_COMPLEX) && ((N < 1 || ((N & 0xfU) != 0)))) {
    __assert_fail("(N%(SIMD_SZ*SIMD_SZ))==0 && N>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jcj83429[P]ShapingClipper/pffft.c"
                  ,0x4c1,"PFFFT_Setup *pffft_new_setup(int, pffft_transform_t)");
  }
  s->N = N;
  s->transform = transform;
  iVar3 = N / 2;
  if (transform != PFFFT_REAL) {
    iVar3 = N;
  }
  iVar7 = iVar3 + 3;
  if (-1 < iVar3) {
    iVar7 = iVar3;
  }
  uVar6 = iVar7 >> 2;
  s->Ncvec = uVar6;
  pvVar4 = malloc((long)(int)(uVar6 * 2) * 0x10 + 0x40);
  if (pvVar4 == (void *)0x0) {
    pafVar13 = (v4sf *)0x0;
  }
  else {
    *(void **)(((ulong)pvVar4 & 0xffffffffffffffc0) + 0x38) = pvVar4;
    pafVar13 = (v4sf *)(((ulong)pvVar4 & 0xffffffffffffffc0) + 0x40);
  }
  iVar3 = uVar6 * 6 + 3;
  if (-1 < (int)(uVar6 * 6)) {
    iVar3 = uVar6 * 6;
  }
  s->data = pafVar13;
  s->e = *pafVar13;
  s->twiddle = pafVar13[iVar3 >> 2];
  if (transform == PFFFT_REAL) {
    if (7 < N) {
      uVar5 = 0;
      dVar20 = 0.0;
      uVar10 = 0;
      do {
        lVar17 = ((ulong)(uVar10 & 3) << 0x20) + (uVar5 >> 2) * 0x1800000000;
        lVar15 = -0x60;
        iVar7 = 1;
        do {
          dVar18 = (double)(float)(((double)iVar7 * -6.283185307179586 * dVar20) / (double)N);
          dVar19 = cos(dVar18);
          *(float *)((long)pafVar13[(uVar5 >> 2) * 6 + 6] + lVar15 + (ulong)(uVar10 & 3) * 4) =
               (float)dVar19;
          dVar18 = sin(dVar18);
          *(float *)((long)pafVar13[1] + (lVar17 >> 0x1e)) = (float)dVar18;
          lVar17 = lVar17 + 0x800000000;
          iVar7 = iVar7 + 1;
          lVar15 = lVar15 + 0x20;
        } while (lVar15 != 0);
        dVar20 = dVar20 + 1.0;
        uVar10 = uVar10 + 1;
        uVar5 = uVar5 + 1;
      } while (uVar10 != uVar6);
    }
    iVar7 = N + 3;
    if (-1 < N) {
      iVar7 = N;
    }
    iVar7 = iVar7 >> 2;
    uVar6 = decompose(iVar7,s->ifac,(int *)rffti1_ps_ntryh);
    if (1 < (int)uVar6) {
      iVar11 = 0;
      uVar5 = 1;
      iVar12 = 1;
      do {
        iVar1 = s->ifac[uVar5 + 1];
        if (1 < iVar1) {
          iVar2 = iVar7 / (iVar1 * iVar12);
          pfVar9 = pafVar13[iVar3 >> 2] + (long)iVar11 + 1;
          iVar14 = 0;
          iVar8 = 1;
          do {
            iVar14 = iVar14 + iVar12;
            if (2 < iVar2) {
              lVar15 = 0;
              do {
                iVar16 = (int)(lVar15 + 1);
                dVar20 = (double)((float)iVar16 * (float)iVar14 * (6.2831855 / (float)iVar7));
                dVar18 = cos(dVar20);
                pfVar9[lVar15 * 2 + -1] = (float)dVar18;
                dVar20 = sin(dVar20);
                pfVar9[lVar15 * 2] = (float)dVar20;
                lVar15 = lVar15 + 1;
              } while ((iVar2 - 3U >> 1) + 1 != iVar16);
            }
            iVar8 = iVar8 + 1;
            pfVar9 = pfVar9 + iVar2;
          } while (iVar8 != iVar1);
          iVar11 = iVar11 + iVar2 * (iVar1 + -1);
        }
        uVar5 = uVar5 + 1;
        iVar12 = iVar1 * iVar12;
      } while (uVar5 != uVar6);
    }
  }
  else {
    if (3 < N) {
      uVar5 = 0;
      dVar20 = 0.0;
      uVar10 = 0;
      do {
        lVar15 = ((ulong)(uVar10 & 3) << 0x20) + (uVar5 >> 2) * 0x1800000000;
        lVar17 = -0x60;
        iVar7 = 1;
        do {
          dVar18 = (double)(float)(((double)iVar7 * -6.283185307179586 * dVar20) / (double)N);
          dVar19 = cos(dVar18);
          *(float *)((long)pafVar13[(uVar5 >> 2) * 6 + 6] + lVar17 + (ulong)(uVar10 & 3) * 4) =
               (float)dVar19;
          dVar18 = sin(dVar18);
          *(float *)((long)pafVar13[1] + (lVar15 >> 0x1e)) = (float)dVar18;
          lVar15 = lVar15 + 0x800000000;
          iVar7 = iVar7 + 1;
          lVar17 = lVar17 + 0x20;
        } while (lVar17 != 0);
        dVar20 = dVar20 + 1.0;
        uVar10 = uVar10 + 1;
        uVar5 = uVar5 + 1;
      } while (uVar10 != uVar6);
    }
    iVar7 = N + 3;
    if (-1 < N) {
      iVar7 = N;
    }
    cffti1_ps(iVar7 >> 2,pafVar13[iVar3 >> 2],s->ifac);
  }
  iVar3 = 1;
  if (0 < (long)s->ifac[1]) {
    lVar15 = 0;
    do {
      iVar3 = iVar3 * s->ifac[lVar15 + 2];
      lVar15 = lVar15 + 1;
    } while (s->ifac[1] != lVar15);
  }
  iVar7 = N + 3;
  if (-1 < N) {
    iVar7 = N;
  }
  if (iVar3 != iVar7 >> 2) {
    pffft_destroy_setup(s);
    s = (PFFFT_Setup *)0x0;
  }
  return s;
}

Assistant:

PFFFT_Setup *pffft_new_setup(int N, pffft_transform_t transform) {
  PFFFT_Setup *s = (PFFFT_Setup*)malloc(sizeof(PFFFT_Setup));
  int k, m;
  /* unfortunately, the fft size must be a multiple of 16 for complex FFTs 
     and 32 for real FFTs -- a lot of stuff would need to be rewritten to
     handle other cases (or maybe just switch to a scalar fft, I don't know..) */
  if (transform == PFFFT_REAL) { assert((N%(2*SIMD_SZ*SIMD_SZ))==0 && N>0); }
  if (transform == PFFFT_COMPLEX) { assert((N%(SIMD_SZ*SIMD_SZ))==0 && N>0); }
  //assert((N % 32) == 0);
  s->N = N;
  s->transform = transform;  
  /* nb of complex simd vectors */
  s->Ncvec = (transform == PFFFT_REAL ? N/2 : N)/SIMD_SZ;
  s->data = (v4sf*)pffft_aligned_malloc(2*s->Ncvec * sizeof(v4sf));
  s->e = (float*)s->data;
  s->twiddle = (float*)(s->data + (2*s->Ncvec*(SIMD_SZ-1))/SIMD_SZ);  

  if (transform == PFFFT_REAL) {
    for (k=0; k < s->Ncvec; ++k) {
      int i = k/SIMD_SZ;
      int j = k%SIMD_SZ;
      for (m=0; m < SIMD_SZ-1; ++m) {
        float A = -2*M_PI*(m+1)*k / N;
        s->e[(2*(i*3 + m) + 0) * SIMD_SZ + j] = cos(A);
        s->e[(2*(i*3 + m) + 1) * SIMD_SZ + j] = sin(A);
      }
    }
    rffti1_ps(N/SIMD_SZ, s->twiddle, s->ifac);
  } else {
    for (k=0; k < s->Ncvec; ++k) {
      int i = k/SIMD_SZ;
      int j = k%SIMD_SZ;
      for (m=0; m < SIMD_SZ-1; ++m) {
        float A = -2*M_PI*(m+1)*k / N;
        s->e[(2*(i*3 + m) + 0)*SIMD_SZ + j] = cos(A);
        s->e[(2*(i*3 + m) + 1)*SIMD_SZ + j] = sin(A);
      }
    }
    cffti1_ps(N/SIMD_SZ, s->twiddle, s->ifac);
  }

  /* check that N is decomposable with allowed prime factors */
  for (k=0, m=1; k < s->ifac[1]; ++k) { m *= s->ifac[2+k]; }
  if (m != N/SIMD_SZ) {
    pffft_destroy_setup(s); s = 0;
  }

  return s;
}